

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool (anonymous_namespace)::readWaveform<float,short>
               (ifstream *fin,TWaveformT<short> *res,int32_t offset,streamsize size)

{
  pointer psVar1;
  undefined1 uVar2;
  undefined1 extraout_AL;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  vector<float,_std::allocator<float>_> buf;
  allocator_type local_61;
  vector<float,_std::allocator<float>_> local_60;
  double local_48;
  undefined8 uStack_40;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(ulong)size >> 2,&local_61);
  std::vector<short,_std::allocator<short>_>::resize(res,((ulong)size >> 2) + (long)offset);
  std::istream::read((char *)fin,
                     (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start);
  uVar4 = (ulong)((long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  dVar7 = 0.0;
  uVar3 = (uint)uVar4;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    dVar8 = 0.0;
    do {
      dVar7 = (double)ABS(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      if ((double)ABS(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5]) <= dVar8) {
        dVar7 = dVar8;
      }
      uVar5 = uVar5 + 1;
      dVar8 = dVar7;
    } while ((uVar3 & 0x7fffffff) != uVar5);
  }
  if (0 < (int)uVar3) {
    local_48 = (double)(~-(ulong)(dVar7 != 0.0) & 0x3ff0000000000000 |
                       (ulong)(1.0 / dVar7) & -(ulong)(dVar7 != 0.0));
    uVar6 = uVar4 & 0xffffffff;
    psVar1 = (res->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uStack_40 = 0;
    do {
      dVar7 = round((double)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar5] * local_48 * 32767.0);
      uVar4 = (ulong)(uint)(int)dVar7;
      psVar1[(long)offset + uVar5] = (short)(int)dVar7;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  uVar2 = (undefined1)uVar4;
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar2 = extraout_AL;
  }
  return (bool)uVar2;
}

Assistant:

bool readWaveform(std::ifstream & fin, TWaveformT<TSample> & res, int32_t offset, std::streamsize size) {
        if (std::is_same<TSample, TSampleI16>::value) {
            std::vector<TSampleInput> buf(size/sizeof(TSampleInput));
            res.resize(offset + size/sizeof(TSampleInput));
            fin.read((char *)(buf.data()), size);
            double amax = calcAbsMax(buf);
            double iamax = amax != 0.0 ? 1.0/amax : 1.0;
            for (auto i = 0; i < (int) buf.size(); ++i) res[offset + i] = std::round(std::numeric_limits<TSampleI16>::max()*(buf[i]*iamax));
        } else if (std::is_same<TSample, TSampleF>::value) {
            res.resize(offset + size/sizeof(TSample));
            fin.read((char *)(res.data() + offset), size);
        } else {
            return false;
        }
        return true;
    }